

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

string * __thiscall
cmGeneratorTarget::NormalGetRealName
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *config)

{
  cmTarget *pcVar1;
  string name;
  string soName;
  string impName;
  string pdbName;
  
  pcVar1 = this->Target;
  if (pcVar1->IsImportedTarget == true) {
    std::__cxx11::string::string
              ((string *)&name,"NormalGetRealName called on imported target: ",(allocator *)&soName)
    ;
    std::__cxx11::string::append((string *)&name);
    cmLocalGenerator::IssueMessage(this->LocalGenerator,INTERNAL_ERROR,&name);
    std::__cxx11::string::~string((string *)&name);
    pcVar1 = this->Target;
  }
  if (pcVar1->TargetTypeValue == EXECUTABLE) {
    name._M_dataplus._M_p = (pointer)&name.field_2;
    name._M_string_length = 0;
    name.field_2._M_local_buf[0] = '\0';
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    soName._M_dataplus._M_p = (pointer)&soName.field_2;
    soName._M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    soName.field_2._M_local_buf[0] = '\0';
    impName._M_dataplus._M_p = (pointer)&impName.field_2;
    impName._M_string_length = 0;
    impName.field_2._M_local_buf[0] = '\0';
    GetExecutableNames(this,&name,__return_storage_ptr__,&soName,&impName,config);
  }
  else {
    name._M_dataplus._M_p = (pointer)&name.field_2;
    name._M_string_length = 0;
    soName._M_dataplus._M_p = (pointer)&soName.field_2;
    soName._M_string_length = 0;
    name.field_2._M_local_buf[0] = '\0';
    soName.field_2._M_local_buf[0] = '\0';
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    impName._M_dataplus._M_p = (pointer)&impName.field_2;
    impName._M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    impName.field_2._M_local_buf[0] = '\0';
    pdbName._M_dataplus._M_p = (pointer)&pdbName.field_2;
    pdbName._M_string_length = 0;
    pdbName.field_2._M_local_buf[0] = '\0';
    GetLibraryNames(this,&name,&soName,__return_storage_ptr__,&impName,&pdbName,config);
    std::__cxx11::string::~string((string *)&pdbName);
  }
  std::__cxx11::string::~string((string *)&impName);
  std::__cxx11::string::~string((string *)&soName);
  std::__cxx11::string::~string((string *)&name);
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::NormalGetRealName(
  const std::string& config) const
{
  // This should not be called for imported targets.
  // TODO: Split cmTarget into a class hierarchy to get compile-time
  // enforcement of the limited imported target API.
  if (this->IsImported()) {
    std::string msg = "NormalGetRealName called on imported target: ";
    msg += this->GetName();
    this->LocalGenerator->IssueMessage(cmake::INTERNAL_ERROR, msg);
  }

  if (this->GetType() == cmStateEnums::EXECUTABLE) {
    // Compute the real name that will be built.
    std::string name;
    std::string realName;
    std::string impName;
    std::string pdbName;
    this->GetExecutableNames(name, realName, impName, pdbName, config);
    return realName;
  }
  // Compute the real name that will be built.
  std::string name;
  std::string soName;
  std::string realName;
  std::string impName;
  std::string pdbName;
  this->GetLibraryNames(name, soName, realName, impName, pdbName, config);
  return realName;
}